

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

uchar * tjLoadImage(char *filename,int *width,int align,int *height,int *pixelFormat,int flags)

{
  JDIMENSION JVar1;
  bool bVar2;
  int iVar3;
  JDIMENSION JVar4;
  uint uVar5;
  j_compress_ptr cinfo;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  cjpeg_source_ptr pcVar8;
  long lVar9;
  uchar *__ptr;
  int iVar10;
  J_COLOR_SPACE JVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  long *in_FS_OFFSET;
  undefined1 auVar15 [16];
  
  auVar15._0_4_ = -(uint)(filename == (char *)0x0);
  auVar15._4_4_ = -(uint)(width == (int *)0x0);
  auVar15._8_4_ = -(uint)(height == (int *)0x0);
  auVar15._12_4_ = -(uint)(pixelFormat == (int *)0x0);
  iVar10 = movmskps((int)height,auVar15);
  if ((iVar10 == 0 && 0 < align) && (0xfffffff2 < *pixelFormat - 0xcU)) {
    if ((align & align - 1U) == 0) {
      cinfo = (j_compress_ptr)tjInitCompress();
      if (cinfo == (j_compress_ptr)0x0) {
        return (uchar *)0x0;
      }
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        lVar9 = *in_FS_OFFSET;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        pcVar12 = "tjLoadImage(): Cannot open input file";
LAB_0010e9ad:
        snprintf((char *)(lVar9 + -0xd0),200,"%s\n%s",pcVar12,pcVar7);
LAB_0010e9c2:
        __ptr = (uchar *)0x0;
        bVar2 = true;
      }
      else {
        iVar10 = getc(__stream);
        if ((iVar10 < 0) || (iVar3 = ungetc(iVar10,__stream), iVar3 == -1)) {
          lVar9 = *in_FS_OFFSET;
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          pcVar12 = "tjLoadImage(): Could not read input file";
          goto LAB_0010e9ad;
        }
        iVar3 = _setjmp((__jmp_buf_tag *)&cinfo[2].restart_interval);
        JVar11 = JCS_UNKNOWN;
        if (iVar3 != 0) goto LAB_0010e9c2;
        if ((long)*pixelFormat != -1) {
          JVar11 = pf2cs[*pixelFormat];
        }
        cinfo->in_color_space = JVar11;
        if (iVar10 == 0x50) {
          pcVar8 = jinit_read_ppm(cinfo);
          if (pcVar8 != (cjpeg_source_ptr)0x0) {
            uVar13 = (uint)flags >> 1 & 1;
            goto LAB_0010ea6c;
          }
LAB_0010eb45:
          in_FS_OFFSET[-0x16] = 0x6d74696220657a69;
          in_FS_OFFSET[-0x15] = 0x6564616f6c207061;
          in_FS_OFFSET[-0x18] = 0x746f6e20646c756f;
          in_FS_OFFSET[-0x17] = 0x6c616974696e6920;
          in_FS_OFFSET[-0x1a] = 0x6d4964616f4c6a74;
          in_FS_OFFSET[-0x19] = 0x43203a2928656761;
          *(undefined2 *)(in_FS_OFFSET + -0x14) = 0x72;
LAB_0010ebb2:
          __ptr = (uchar *)0x0;
LAB_0010ebb4:
          bVar2 = true;
        }
        else {
          if (iVar10 != 0x42) {
            in_FS_OFFSET[-0x18] = 0x74726f707075736e;
            in_FS_OFFSET[-0x17] = 0x20656c6966206465;
            in_FS_OFFSET[-0x1a] = 0x6d4964616f4c6a74;
            in_FS_OFFSET[-0x19] = 0x55203a2928656761;
            *(undefined8 *)((long)in_FS_OFFSET + -0xb3) = 0x6570797420656c;
            goto LAB_0010e9c2;
          }
          pcVar8 = jinit_read_bmp(cinfo,0);
          if (pcVar8 == (cjpeg_source_ptr)0x0) goto LAB_0010eb45;
          uVar13 = (uint)((flags & 2U) == 0);
LAB_0010ea6c:
          pcVar8->input_file = (FILE *)__stream;
          (*pcVar8->start_input)(cinfo,pcVar8);
          (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
          *width = cinfo->image_width;
          *height = cinfo->image_height;
          iVar10 = cs2pf[cinfo->in_color_space];
          *pixelFormat = iVar10;
          lVar9 = (long)(int)(-align & (tjPixelSize[iVar10] * *width + align) - 1U);
          __ptr = (uchar *)malloc(*height * lVar9);
          if (__ptr == (uchar *)0x0) {
            builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb7),"ocation ",8);
            builtin_strncpy((char *)((long)in_FS_OFFSET + -0xaf),"failure",8);
            in_FS_OFFSET[-0x18] = 0x6c612079726f6d65;
            in_FS_OFFSET[-0x17] = 0x6e6f697461636f6c;
            in_FS_OFFSET[-0x1a] = 0x6d4964616f4c6a74;
            in_FS_OFFSET[-0x19] = 0x4d203a2928656761;
            goto LAB_0010ebb2;
          }
          iVar10 = _setjmp((__jmp_buf_tag *)&cinfo[2].restart_interval);
          if (iVar10 != 0) goto LAB_0010ebb4;
          uVar5 = cinfo->next_scanline;
          while (uVar5 < cinfo->image_height) {
            JVar4 = (*pcVar8->get_pixel_rows)(cinfo,pcVar8);
            uVar5 = 0;
            if (0 < (int)JVar4) {
              uVar5 = JVar4;
            }
            JVar1 = cinfo->next_scanline;
            for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
              if (uVar13 == 0) {
                iVar10 = JVar1 + (int)uVar14;
              }
              else {
                iVar10 = ~(JVar1 + (int)uVar14) + *height;
              }
              memcpy(__ptr + iVar10 * lVar9,pcVar8->buffer[uVar14],
                     (long)tjPixelSize[*pixelFormat] * (long)*width);
            }
            uVar5 = JVar1 + JVar4;
            cinfo->next_scanline = uVar5;
          }
          (*pcVar8->finish_input)(cinfo,pcVar8);
          bVar2 = false;
        }
      }
      tjDestroy(cinfo);
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (!bVar2) {
        return __ptr;
      }
      goto LAB_0010e877;
    }
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb2),"be a pow",8);
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xaa),"er of 2",8);
    in_FS_OFFSET[-0x18] = 0x746e656d6e67696c;
    in_FS_OFFSET[-0x17] = 0x6562207473756d20;
    lVar9._0_1_ = 'a';
    lVar9._1_1_ = 'g';
    lVar9._2_1_ = 'e';
    lVar9._3_1_ = '(';
    lVar9._4_1_ = ')';
    lVar9._5_1_ = ':';
    lVar9._6_1_ = ' ';
    lVar9._7_1_ = 'A';
  }
  else {
    in_FS_OFFSET[-0x18] = 0x612064696c61766e;
    in_FS_OFFSET[-0x17] = 0x746e656d756772;
    lVar9._0_1_ = 'a';
    lVar9._1_1_ = 'g';
    lVar9._2_1_ = 'e';
    lVar9._3_1_ = '(';
    lVar9._4_1_ = ')';
    lVar9._5_1_ = ':';
    lVar9._6_1_ = ' ';
    lVar9._7_1_ = 'I';
  }
  in_FS_OFFSET[-0x1a] = 0x6d4964616f4c6a74;
  in_FS_OFFSET[-0x19] = lVar9;
  __ptr = (uchar *)0x0;
LAB_0010e877:
  free(__ptr);
  return (uchar *)0x0;
}

Assistant:

DLLEXPORT unsigned char *tjLoadImage(const char *filename, int *width,
                                     int align, int *height, int *pixelFormat,
                                     int flags)
{
  int retval = 0, tempc;
  size_t pitch;
  tjhandle handle = NULL;
  tjinstance *this;
  j_compress_ptr cinfo = NULL;
  cjpeg_source_ptr src;
  unsigned char *dstBuf = NULL;
  FILE *file = NULL;
  boolean invert;

  if (!filename || !width || align < 1 || !height || !pixelFormat ||
      *pixelFormat < TJPF_UNKNOWN || *pixelFormat >= TJ_NUMPF)
    THROWG("tjLoadImage(): Invalid argument");
  if ((align & (align - 1)) != 0)
    THROWG("tjLoadImage(): Alignment must be a power of 2");

  if ((handle = tjInitCompress()) == NULL) return NULL;
  this = (tjinstance *)handle;
  cinfo = &this->cinfo;

  if ((file = fopen(filename, "rb")) == NULL)
    THROW_UNIX("tjLoadImage(): Cannot open input file");

  if ((tempc = getc(file)) < 0 || ungetc(tempc, file) == EOF)
    THROW_UNIX("tjLoadImage(): Could not read input file")
  else if (tempc == EOF)
    THROWG("tjLoadImage(): Input file contains no data");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (*pixelFormat == TJPF_UNKNOWN) cinfo->in_color_space = JCS_UNKNOWN;
  else cinfo->in_color_space = pf2cs[*pixelFormat];
  if (tempc == 'B') {
    if ((src = jinit_read_bmp(cinfo, FALSE)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else if (tempc == 'P') {
    if ((src = jinit_read_ppm(cinfo)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  } else
    THROWG("tjLoadImage(): Unsupported file type");

  src->input_file = file;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* Refuse to load images larger than 1 Megapixel when fuzzing. */
  if (flags & TJFLAG_FUZZING)
    src->max_pixels = 1048576;
#endif
  (*src->start_input) (cinfo, src);
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  *width = cinfo->image_width;  *height = cinfo->image_height;
  *pixelFormat = cs2pf[cinfo->in_color_space];

  pitch = PAD((*width) * tjPixelSize[*pixelFormat], align);
  if ((unsigned long long)pitch * (unsigned long long)(*height) >
      (unsigned long long)((size_t)-1) ||
      (dstBuf = (unsigned char *)malloc(pitch * (*height))) == NULL)
    THROWG("tjLoadImage(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  while (cinfo->next_scanline < cinfo->image_height) {
    int i, nlines = (*src->get_pixel_rows) (cinfo, src);

    for (i = 0; i < nlines; i++) {
      unsigned char *dstptr;
      int row;

      row = cinfo->next_scanline + i;
      if (invert) dstptr = &dstBuf[((*height) - row - 1) * pitch];
      else dstptr = &dstBuf[row * pitch];
      memcpy(dstptr, src->buffer[i], (*width) * tjPixelSize[*pixelFormat]);
    }
    cinfo->next_scanline += nlines;
  }

  (*src->finish_input) (cinfo, src);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  if (retval < 0) { free(dstBuf);  dstBuf = NULL; }
  return dstBuf;
}